

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_hub.cpp
# Opt level: O3

void G_LeavingHub(int mode,cluster_info_t *cluster,wbstartstruct_t *wbs)

{
  FHubInfo *pFVar1;
  int *piVar2;
  undefined4 uVar3;
  undefined4 uVar6;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar7;
  uint uVar8;
  long lVar9;
  char *pcVar10;
  int *piVar11;
  ulong uVar12;
  FHubInfo *pFVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  
  uVar8 = hubdata.Count;
  if ((cluster->flags & 1) == 0) goto LAB_004de7d8;
  uVar12 = (ulong)hubdata.Count;
  if (uVar12 == 0) {
    uVar15 = 0;
LAB_004de866:
    pFVar13 = hubdata.Array;
    uVar16 = uVar15;
    if ((uint)uVar15 == uVar8) goto LAB_004de86b;
  }
  else {
    uVar15 = 0;
    pFVar13 = hubdata.Array;
    do {
      if (pFVar13->finished_ep == level.levelnum) {
        pFVar13->finished_ep = wbs->finished_ep;
        iVar14 = wbs->maxitems;
        iVar17 = wbs->maxsecret;
        iVar18 = wbs->maxfrags;
        pFVar13->maxkills = wbs->maxkills;
        pFVar13->maxitems = iVar14;
        pFVar13->maxsecret = iVar17;
        pFVar13->maxfrags = iVar18;
        memcpy(pFVar13->plyr,wbs->plyr,0x1c0);
        goto LAB_004de866;
      }
      uVar15 = uVar15 + 1;
      pFVar13 = pFVar13 + 1;
      uVar16 = uVar12;
    } while (uVar12 != uVar15);
LAB_004de86b:
    TArray<FHubInfo,_FHubInfo>::Grow(&hubdata,1);
    pFVar13 = hubdata.Array;
    uVar15 = (ulong)hubdata.Count;
    hubdata.Count = hubdata.Count + 1;
    uVar12 = (ulong)hubdata.Count;
    pFVar1 = hubdata.Array + uVar15;
    pFVar1->finished_ep = wbs->finished_ep;
    iVar14 = wbs->maxitems;
    iVar17 = wbs->maxsecret;
    iVar18 = wbs->maxfrags;
    pFVar1->maxkills = wbs->maxkills;
    pFVar1->maxitems = iVar14;
    pFVar1->maxsecret = iVar17;
    pFVar1->maxfrags = iVar18;
    memcpy(pFVar1->plyr,wbs->plyr,0x1c0);
    uVar15 = uVar16;
  }
  uVar15 = uVar15 & 0xffffffff;
  pFVar13[uVar15].finished_ep = level.levelnum;
  if ((multiplayer == false) && (deathmatch.Value == 0)) {
    pFVar13[uVar15].plyr[0].skills = level.killed_monsters;
    pFVar13[uVar15].plyr[0].sitems = level.found_items;
    pFVar13[uVar15].plyr[0].ssecret = level.found_secrets;
  }
  if (mode == 0) {
    return;
  }
  wbs->maxsecret = 0;
  wbs->maxkills = 0;
  wbs->maxitems = 0;
  lVar9 = 0;
  do {
    *(undefined4 *)((long)wbs->plyr[0].frags + lVar9 + -8) = 0;
    *(undefined8 *)((long)wbs->plyr[0].frags + lVar9 + -0x10) = 0;
    lVar9 = lVar9 + 0x38;
  } while (lVar9 != 0x1c0);
  if ((int)uVar12 != 0) {
    piVar11 = &pFVar13->plyr[0].ssecret;
    iVar17 = 0;
    iVar18 = 0;
    uVar15 = 0;
    iVar14 = 0;
    do {
      uVar3 = pFVar13[uVar15].maxkills;
      uVar6 = pFVar13[uVar15].maxitems;
      iVar7 = pFVar13[uVar15].maxsecret;
      lVar9 = 0;
      do {
        uVar4 = *(undefined8 *)((long)piVar11 + lVar9 + -8);
        uVar5 = *(undefined8 *)((long)wbs->plyr[0].frags + lVar9 + -0x10);
        *(ulong *)((long)wbs->plyr[0].frags + lVar9 + -0x10) =
             CONCAT44((int)((ulong)uVar5 >> 0x20) + (int)((ulong)uVar4 >> 0x20),
                      (int)uVar5 + (int)uVar4);
        piVar2 = (int *)((long)wbs->plyr[0].frags + lVar9 + -8);
        *piVar2 = *piVar2 + *(int *)((long)piVar11 + lVar9);
        lVar9 = lVar9 + 0x38;
      } while (lVar9 != 0x1c0);
      iVar17 = iVar17 + uVar3;
      iVar18 = iVar18 + uVar6;
      iVar14 = iVar14 + iVar7;
      uVar15 = uVar15 + 1;
      piVar11 = piVar11 + 0x75;
    } while (uVar15 != uVar12);
    wbs->maxkills = iVar17;
    wbs->maxitems = iVar18;
    wbs->maxsecret = iVar14;
  }
  pcVar10 = (cluster->ClusterName).Chars;
  if (*(int *)(pcVar10 + -0xc) != 0) {
    if ((cluster->flags & 0x40) == 0) {
      FString::operator=(&level.LevelName,&cluster->ClusterName);
    }
    else {
      pcVar10 = FStringTable::operator()(&GStrings,pcVar10);
      FString::operator=(&level.LevelName,pcVar10);
    }
  }
LAB_004de7d8:
  if ((mode != 0) && (hubdata.Count != 0)) {
    hubdata.Count = 0;
  }
  return;
}

Assistant:

void G_LeavingHub(int mode, cluster_info_t * cluster, wbstartstruct_t * wbs)
{
	unsigned int i,j;

	if (cluster->flags & CLUSTER_HUB)
	{
		for(i=0;i<hubdata.Size();i++)
		{
			if (hubdata[i].finished_ep==level.levelnum)
			{
				hubdata[i]=*wbs;
				break;
			}
		}
		if (i==hubdata.Size())
		{
			hubdata[hubdata.Reserve(1)] = *wbs;
		}

		hubdata[i].finished_ep=level.levelnum;
		if (!multiplayer && !deathmatch)
		{
			// The player counters don't work in hubs
			hubdata[i].plyr[0].skills=level.killed_monsters;
			hubdata[i].plyr[0].sitems=level.found_items;
			hubdata[i].plyr[0].ssecret=level.found_secrets;
		}


		if (mode!=FINISH_SameHub)
		{
			wbs->maxkills=wbs->maxitems=wbs->maxsecret=0;
			for(i=0;i<MAXPLAYERS;i++)
			{
				wbs->plyr[i].sitems=wbs->plyr[i].skills=wbs->plyr[i].ssecret=0;
			}

			for(i=0;i<hubdata.Size();i++)
			{
				wbs->maxkills += hubdata[i].maxkills;
				wbs->maxitems += hubdata[i].maxitems;
				wbs->maxsecret += hubdata[i].maxsecret;
				for(j=0;j<MAXPLAYERS;j++)
				{
					wbs->plyr[j].sitems += hubdata[i].plyr[j].sitems;
					wbs->plyr[j].skills += hubdata[i].plyr[j].skills;
					wbs->plyr[j].ssecret += hubdata[i].plyr[j].ssecret;
				}
			}
			if (cluster->ClusterName.IsNotEmpty()) 
			{
				if (cluster->flags & CLUSTER_LOOKUPNAME)
				{
					level.LevelName = GStrings(cluster->ClusterName);
				}
				else
				{
					level.LevelName = cluster->ClusterName;
				}
			}
		}
	}
	if (mode!=FINISH_SameHub) hubdata.Clear();
}